

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

float __thiscall
tcu::Texture2DArrayView::sampleCompareOffset
          (Texture2DArrayView *this,Sampler *sampler,float ref,float s,float t,float r,float lod,
          IVec2 *offset)

{
  int numLevels;
  ConstPixelBufferAccess *levels;
  undefined8 uVar1;
  float fVar2;
  IVec3 local_30;
  
  levels = this->m_levels;
  numLevels = this->m_numLevels;
  uVar1 = *(undefined8 *)offset->m_data;
  local_30.m_data[2] = selectLayer(this,r);
  local_30.m_data._0_8_ = uVar1;
  fVar2 = sampleLevelArray2DCompare(levels,numLevels,sampler,ref,s,t,lod,&local_30);
  return fVar2;
}

Assistant:

float Texture2DArrayView::sampleCompareOffset (const Sampler& sampler, float ref, float s, float t, float r, float lod, const IVec2& offset) const
{
	return sampleLevelArray2DCompare(m_levels, m_numLevels, sampler, ref, s, t, lod, IVec3(offset.x(), offset.y(), selectLayer(r)));
}